

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
          (substitute_internal *this,Nonnull<std::string_*> output,string_view format,
          Nullable<const_absl::string_view_*> args_array,size_t num_args)

{
  Nonnull<std::string_*> pbVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  size_t __n;
  Nonnull<std::string_*> pbVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  ptrdiff_t _Num;
  ulong uVar9;
  char *__dest;
  string_view src;
  string_view src_00;
  string_view src_01;
  string death_message;
  string local_78;
  substitute_internal *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar6 = format._M_str;
  src._M_len = format._M_len;
  if (output != (Nonnull<std::string_*>)0x0) {
    uVar9 = 0;
    pbVar5 = (Nonnull<std::string_*>)0x0;
    do {
      lVar7 = 1;
      if (*(char *)((long)&(pbVar5->_M_dataplus)._M_p + src._M_len) == '$') {
        pbVar5 = (Nonnull<std::string_*>)((long)&(pbVar5->_M_dataplus)._M_p + 1);
        if (output <= pbVar5) {
          src._M_str = (char *)0x1;
          CEscape_abi_cxx11_(&local_78,(lts_20250127 *)output,src);
          raw_log_internal::RawLog
                    (kFatal,"substitute.cc",0x31,"Invalid absl::Substitute() format string: \"%s\"."
                     ,local_78._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_78);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/substitute.cc"
                        ,0x31,
                        "void absl::substitute_internal::SubstituteAndAppendArray(absl::Nonnull<std::string *>, absl::string_view, absl::Nullable<const absl::string_view *>, size_t)"
                       );
        }
        bVar2 = *(byte *)((long)&(pbVar5->_M_dataplus)._M_p + src._M_len);
        if ((byte)(bVar2 - 0x30) < 10) {
          uVar8 = bVar2 - 0x30;
          if (args_array <= (Nullable<const_absl::string_view_*>)(ulong)uVar8) {
            src_01._M_str = (char *)0x1;
            src_01._M_len = src._M_len;
            CEscape_abi_cxx11_(&local_78,(lts_20250127 *)output,src_01);
            raw_log_internal::RawLog
                      (kFatal,"substitute.cc",0x3e,
                       "Invalid absl::Substitute() format string: asked for \"$%d\", but only %d args were given.  Full format string was: \"%s\"."
                       ,(ulong)uVar8,(ulong)args_array & 0xffffffff,local_78._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_78);
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/substitute.cc"
                          ,0x3e,
                          "void absl::substitute_internal::SubstituteAndAppendArray(absl::Nonnull<std::string *>, absl::string_view, absl::Nullable<const absl::string_view *>, size_t)"
                         );
          }
          lVar7 = *(long *)(pcVar6 + (long)(ulong)uVar8 * 0x10);
        }
        else if (bVar2 != 0x24) {
          src_00._M_str = (char *)0x1;
          src_00._M_len = src._M_len;
          CEscape_abi_cxx11_(&local_78,(lts_20250127 *)output,src_00);
          raw_log_internal::RawLog
                    (kFatal,"substitute.cc",0x4b,"Invalid absl::Substitute() format string: \"%s\"."
                     ,local_78._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_78);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/substitute.cc"
                        ,0x4b,
                        "void absl::substitute_internal::SubstituteAndAppendArray(absl::Nonnull<std::string *>, absl::string_view, absl::Nullable<const absl::string_view *>, size_t)"
                       );
        }
      }
      uVar9 = uVar9 + lVar7;
      pbVar5 = (Nonnull<std::string_*>)((long)&(pbVar5->_M_dataplus)._M_p + 1);
    } while (pbVar5 < output);
    if (uVar9 != 0) {
      uVar4 = *(ulong *)(this + 8);
      if (CARRY8(uVar9,uVar4)) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,
                   "Check size <= std::numeric_limits<size_t>::max() - original_size failed: ","");
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"size_t overflow","");
        std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                  (3,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/substitute.cc"
                   ,0x5a,&local_78);
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/substitute.cc"
                      ,0x5a,
                      "void absl::substitute_internal::SubstituteAndAppendArray(absl::Nonnull<std::string *>, absl::string_view, absl::Nullable<const absl::string_view *>, size_t)"
                     );
      }
      strings_internal::STLStringResizeUninitializedAmortized<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 uVar9 + uVar4);
      lVar7 = *(long *)this;
      __dest = (char *)(uVar4 + lVar7);
      if (output != (Nonnull<std::string_*>)0x0) {
        pbVar5 = (Nonnull<std::string_*>)0x0;
        local_58 = this;
        do {
          cVar3 = *(char *)((long)&(pbVar5->_M_dataplus)._M_p + src._M_len);
          if (cVar3 == '$') {
            pbVar1 = (Nonnull<std::string_*>)((long)&(pbVar5->_M_dataplus)._M_p + 1);
            bVar2 = *(byte *)((long)&(pbVar5->_M_dataplus)._M_p + src._M_len + 1);
            if ((byte)(bVar2 - 0x30) < 10) {
              __n = *(size_t *)(pcVar6 + (ulong)bVar2 * 0x10 + -0x300);
              if (__n != 0) {
                memmove(__dest,*(void **)(pcVar6 + (ulong)bVar2 * 0x10 + -0x2f8),__n);
              }
              __dest = __dest + __n;
              pbVar5 = pbVar1;
            }
            else if (bVar2 == 0x24) {
              *__dest = '$';
              __dest = __dest + 1;
              pbVar5 = pbVar1;
            }
          }
          else {
            *__dest = cVar3;
            __dest = __dest + 1;
          }
          pbVar5 = (Nonnull<std::string_*>)((long)&(pbVar5->_M_dataplus)._M_p + 1);
        } while (pbVar5 < output);
        lVar7 = *(long *)local_58;
        this = local_58;
      }
      if (__dest != (char *)(lVar7 + *(long *)(this + 8))) {
        __assert_fail("target == output->data() + output->size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/substitute.cc"
                      ,0x6d,
                      "void absl::substitute_internal::SubstituteAndAppendArray(absl::Nonnull<std::string *>, absl::string_view, absl::Nullable<const absl::string_view *>, size_t)"
                     );
      }
    }
  }
  return;
}

Assistant:

void SubstituteAndAppendArray(
    absl::Nonnull<std::string*> output, absl::string_view format,
    absl::Nullable<const absl::string_view*> args_array, size_t num_args) {
  // Determine total size needed.
  size_t size = 0;
  for (size_t i = 0; i < format.size(); i++) {
    if (format[i] == '$') {
      if (i + 1 >= format.size()) {
#ifndef NDEBUG
        ABSL_RAW_LOG(FATAL,
                     "Invalid absl::Substitute() format string: \"%s\".",
                     absl::CEscape(format).c_str());
#endif
        return;
      } else if (absl::ascii_isdigit(
                     static_cast<unsigned char>(format[i + 1]))) {
        int index = format[i + 1] - '0';
        if (static_cast<size_t>(index) >= num_args) {
#ifndef NDEBUG
          ABSL_RAW_LOG(
              FATAL,
              "Invalid absl::Substitute() format string: asked for \"$"
              "%d\", but only %d args were given.  Full format string was: "
              "\"%s\".",
              index, static_cast<int>(num_args), absl::CEscape(format).c_str());
#endif
          return;
        }
        size += args_array[index].size();
        ++i;  // Skip next char.
      } else if (format[i + 1] == '$') {
        ++size;
        ++i;  // Skip next char.
      } else {
#ifndef NDEBUG
        ABSL_RAW_LOG(FATAL,
                     "Invalid absl::Substitute() format string: \"%s\".",
                     absl::CEscape(format).c_str());
#endif
        return;
      }
    } else {
      ++size;
    }
  }

  if (size == 0) return;

  // Build the string.
  size_t original_size = output->size();
  ABSL_INTERNAL_CHECK(
      size <= std::numeric_limits<size_t>::max() - original_size,
      "size_t overflow");
  strings_internal::STLStringResizeUninitializedAmortized(output,
                                                          original_size + size);
  char* target = &(*output)[original_size];
  for (size_t i = 0; i < format.size(); i++) {
    if (format[i] == '$') {
      if (absl::ascii_isdigit(static_cast<unsigned char>(format[i + 1]))) {
        const absl::string_view src = args_array[format[i + 1] - '0'];
        target = std::copy(src.begin(), src.end(), target);
        ++i;  // Skip next char.
      } else if (format[i + 1] == '$') {
        *target++ = '$';
        ++i;  // Skip next char.
      }
    } else {
      *target++ = format[i];
    }
  }

  assert(target == output->data() + output->size());
}